

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.h
# Opt level: O2

void getChildItem(string *path)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  undefined1 *puVar5;
  long lVar6;
  string sStack_d18;
  char *local_cf8;
  long local_cf0;
  char *local_cd8;
  long local_cd0;
  undefined8 auStack_cc8 [2];
  string names [100];
  
  lVar3 = 0x10;
  do {
    puVar5 = (undefined1 *)((long)&names[0]._M_dataplus._M_p + lVar3);
    *(undefined1 **)((long)auStack_cc8 + lVar3) = puVar5;
    *(undefined8 *)((long)auStack_cc8 + lVar3 + 8) = 0;
    *puVar5 = 0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0xc90);
  std::__cxx11::string::string((string *)&sStack_d18,(string *)path);
  iVar1 = parsePath(&sStack_d18,names);
  std::__cxx11::string::~string((string *)&sStack_d18);
  std::__cxx11::string::string((string *)&local_cd8,(string *)path);
  iVar2 = doesExist(names,iVar1,local_cd0 == 0 || *local_cd8 != '/');
  std::__cxx11::string::~string((string *)&local_cd8);
  if (iVar2 == iVar1) {
    std::__cxx11::string::string((string *)&local_cf8,(string *)path);
    iVar1 = getId(names,iVar1,local_cf0 == 0 || *local_cf8 != '/');
    std::__cxx11::string::~string((string *)&local_cf8);
    lVar3 = (long)inodes[iVar1].i_blocks[0] * 0x1000;
    for (lVar6 = 0; lVar6 != 0x1000; lVar6 = lVar6 + 0x100) {
      if (emptyspaces[lVar6 + lVar3] != '\0') {
        poVar4 = std::operator<<((ostream *)&std::cout,emptyspaces + lVar6 + lVar3);
        poVar4 = std::operator<<(poVar4,"\t");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,inodes[*(int *)(emptyspaces + lVar6 + lVar3 + 0xfc)].i_file_size)
        ;
        poVar4 = std::operator<<(poVar4,"B");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)path);
    std::operator<<(poVar4,": No such file or directory.\n");
  }
  lVar3 = 0xc60;
  do {
    std::__cxx11::string::~string((string *)((long)&names[0]._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  return;
}

Assistant:

void getChildItem(string path) {
    int cur_inode;
    string names[100];
    int layers = parsePath(path, names);
    if (doesExist(names, layers, getPathType(path) == RELATIVE_PATH) != layers) {
        cout << path << ": No such file or directory.\n";
        return;
    }
    cur_inode = getId(names, layers, getPathType(path) == RELATIVE_PATH);
    int blocks = inodes[cur_inode].i_blocks[0];
    dir_block *p = getAddressByLocation_Folder(blocks);
    for (int i = 0; i < 16; i++) {
        if (strcmp(p->dirs[i].name, "") != 0)//非空
        {
            if (inodes[p->dirs[i].inode_id].i_mode == A_FOLDER)
            {
                setColor(COLOR_FOLDER);
            }
            cout << p->dirs[i].name << "\t" << inodes[p->dirs[i].inode_id].i_file_size << "B" << endl;
            setColor(COLOR_ORIGIN);
        }
    }
}